

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBuilderBeamIGA::BuildBeam
          (ChBuilderBeamIGA *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,ChLineBspline *spline,
          ChVector<double> *Ydir)

{
  int iVar1;
  pointer pCVar2;
  ChMesh *pCVar3;
  undefined1 auVar4 [16];
  double dVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  Scalar *__x;
  uint uVar9;
  int i_el_knot;
  long lVar10;
  __shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2> *this_00;
  int i_el_node;
  ulong uVar11;
  long lVar12;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> hnode_i;
  ChVector<double> pos;
  shared_ptr<chrono::fea::ChElementBase> local_198;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_188;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  mynodes;
  ChVector<double> tangent;
  __shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2> local_140;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_130;
  ChMatrix33<double> mrot;
  _Vector_base<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> my_el_knots;
  
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ::clear(&this->beam_elems);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(&this->beam_nodes);
  iVar1 = spline->p;
  uVar6 = ~(iVar1 * 2) +
          (int)(spline->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
  mynodes.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mynodes.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mynodes.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar10 = 0x10;
  uVar11 = 0;
  while( true ) {
    pCVar2 = (spline->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(spline->points).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2;
    uVar8 = lVar7 / 0x18;
    if (uVar8 <= uVar11) break;
    pos.m_data[0] = *(double *)((long)pCVar2->m_data + lVar10 + -0x10);
    pos.m_data[1] = *(double *)((long)pCVar2->m_data + lVar10 + -8);
    pos.m_data[2] = *(double *)((long)pCVar2->m_data + lVar10);
    tangent.m_data[2] = 0.0;
    auVar4._8_8_ = in_XMM2_Qb;
    auVar4._0_8_ = in_XMM2_Qa;
    vcvtusi2sd_avx512f(auVar4,uVar8 - 1);
    tangent.m_data[0] = 0.0;
    tangent.m_data[1] = 0.0;
    (*(spline->super_ChLine).super_ChGeometry._vptr_ChGeometry[0xc])(spline,&tangent,lVar7 % 0x18);
    ChMatrix33<double>::Set_A_Xdir(&mrot,&tangent,Ydir);
    ChFrame<double>::ChFrame((ChFrame<double> *)&my_el_knots,&pos,&mrot);
    chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
              ((chrono_types *)&hnode_i,(ChFrame<double> *)&my_el_knots);
    pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
              ((__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> *)&local_188,
               &hnode_i.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              );
    ChMesh::AddNode(pCVar3,&local_188);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_188.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(&mynodes,&hnode_i);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(&this->beam_nodes,&hnode_i);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&hnode_i.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0x18;
  }
  uVar9 = iVar1 * 2 + 2;
  lVar10 = 0;
  for (uVar11 = 0; uVar11 != (~((int)uVar6 >> 0x1f) & uVar6); uVar11 = uVar11 + 1) {
    my_el_knots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    my_el_knots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    my_el_knots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (uVar8 = 0; (~((int)uVar9 >> 0x1f) & uVar9) != uVar8; uVar8 = uVar8 + 1) {
      __x = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&spline->knots,
                       uVar11 + uVar8);
      std::vector<double,_std::allocator<double>_>::push_back(&my_el_knots,__x);
    }
    mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    mrot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    lVar7 = lVar10;
    for (lVar12 = 0; lVar12 <= iVar1; lVar12 = lVar12 + 1) {
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   *)&mrot,(value_type *)
                           ((long)&((mynodes.
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar7));
      lVar7 = lVar7 + 0x10;
    }
    std::make_shared<chrono::fea::ChElementBeamIGA>();
    dVar5 = pos.m_data[0];
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::vector(&local_130,
             (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              *)&mrot);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_d0,&my_el_knots);
    (**(code **)(*(long *)dVar5 + 0xe0))(dVar5,&local_130,&local_d0,iVar1);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d0);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::~vector(&local_130);
    this_00 = (__shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)pos.m_data[0] + 0x188);
    std::__shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_140,
               &sect->
                super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
    pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementBeamIGA,void>
              ((__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> *)&local_198,
               (__shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2> *)&pos);
    ChMesh::AddElement(pCVar3,&local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_198.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
    ::push_back(&this->beam_elems,(value_type *)&pos);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pos.m_data + 1));
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               *)&mrot);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&my_el_knots.super__Vector_base<double,_std::allocator<double>_>);
    lVar10 = lVar10 + 0x10;
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::~vector(&mynodes);
  return;
}

Assistant:

void ChBuilderBeamIGA::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                 std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                 geometry::ChLineBspline& spline,  // the B-spline to be used as the centerline
                                 const ChVector<> Ydir             // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    int p = spline.GetOrder();

    // compute N of spans (excluding start and end multiple knots with zero lenght span):
    int N = (int)spline.Knots().size() - p - p - 1;  // = n+p+1 -p-p-1 = n-p

    // Create the 'complete' stl vector of control points, with uniform distribution
    std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes;
    for (int i_node = 0; i_node < spline.Points().size(); ++i_node) {
        double abscyssa = ((double)i_node / (double)(spline.Points().size() - 1));

        // position of node
        ChVector<> pos = spline.Points()[i_node];

        // rotation of node, x aligned to tangent at input spline
        ChMatrix33<> mrot;
        ChVector<> tangent;
        spline.Derive(tangent, abscyssa);
        mrot.Set_A_Xdir(tangent, Ydir);

        auto hnode_i = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(hnode_i);
        mynodes.push_back(hnode_i);
        this->beam_nodes.push_back(hnode_i);
    }

    // Create the single elements by picking a subset of the nodes and control points
    for (int i_el = 0; i_el < N; ++i_el) {
        std::vector<double> my_el_knots;
        for (int i_el_knot = 0; i_el_knot < p + p + 1 + 1; ++i_el_knot) {
            my_el_knots.push_back(spline.Knots()(i_el + i_el_knot));
        }

        std::vector<std::shared_ptr<ChNodeFEAxyzrot>> my_el_nodes;
        for (int i_el_node = 0; i_el_node < p + 1; ++i_el_node) {
            my_el_nodes.push_back(mynodes[i_el + i_el_node]);
        }

        auto belement_i = chrono_types::make_shared<ChElementBeamIGA>();
        belement_i->SetNodesGenericOrder(my_el_nodes, my_el_knots, p);
        belement_i->SetSection(sect);
        mesh->AddElement(belement_i);
        this->beam_elems.push_back(belement_i);
    }
}